

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t
ctrl_set_bitrate_one_pass_cbr(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  AV1_PRIMARY *pAVar3;
  AV1_COMP *cpi;
  long lVar4;
  int64_t iVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  aom_codec_err_t aVar11;
  aom_codec_err_t aVar12;
  int iVar13;
  
  pAVar3 = ctx->ppi;
  cpi = pAVar3->cpi;
  aVar12 = AOM_CODEC_INVALID_PARAM;
  if ((((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
       ((cpi->oxcf).mode == '\x01')) &&
      (((cpi->oxcf).gf_cfg.lag_in_frames == 0 && ((cpi->oxcf).rc_cfg.mode == AOM_CBR)))) &&
     ((cpi->ppi->use_svc == 0 &&
      ((pAVar3->num_fp_contexts == 1 && (pAVar3->cpi_lap == (AV1_COMP *)0x0)))))) {
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar6 = (uint *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar6 = (uint *)args->overflow_arg_area;
      args->overflow_arg_area = puVar6 + 2;
    }
    uVar1 = *puVar6;
    (ctx->cfg).rc_target_bitrate = uVar1;
    lVar7 = (long)(int)uVar1 * 1000;
    (cpi->oxcf).rc_cfg.target_bandwidth = lVar7;
    lVar4 = (cpi->oxcf).rc_cfg.optimal_buffer_level_ms;
    lVar10 = (cpi->oxcf).rc_cfg.maximum_buffer_size_ms;
    (pAVar3->p_rc).starting_buffer_level =
         ((cpi->oxcf).rc_cfg.starting_buffer_level_ms * lVar7) / 1000;
    lVar8 = lVar7 >> 3;
    lVar9 = lVar8;
    if (lVar4 != 0) {
      lVar9 = (lVar4 * lVar7) / 1000;
    }
    (pAVar3->p_rc).optimal_buffer_level = lVar9;
    if (lVar10 != 0) {
      lVar8 = (lVar10 * lVar7) / 1000;
    }
    (pAVar3->p_rc).maximum_buffer_size = lVar8;
    lVar4 = (pAVar3->p_rc).buffer_level;
    lVar10 = (pAVar3->p_rc).bits_off_target;
    if (lVar8 <= lVar10) {
      lVar10 = lVar8;
    }
    (pAVar3->p_rc).bits_off_target = lVar10;
    if (lVar4 < lVar8) {
      lVar8 = lVar4;
    }
    (pAVar3->p_rc).buffer_level = lVar8;
    av1_new_framerate(cpi,cpi->framerate);
    aVar11 = AOM_CODEC_OK;
    aVar12 = AOM_CODEC_OK;
    if ((uint)(cpi->svc).number_spatial_layers < (cpi->common).current_frame.frame_number) {
      pAVar3 = cpi->ppi;
      aVar12 = aVar11;
      if (pAVar3->use_svc == 0) {
        iVar2 = (cpi->rc).avg_frame_bandwidth;
        iVar13 = (cpi->rc).prev_avg_frame_bandwidth >> 1;
        if (iVar13 < iVar2 / 3 || iVar2 < iVar13) {
          (cpi->rc).rc_1_frame = 0;
          (cpi->rc).rc_2_frame = 0;
          iVar5 = (pAVar3->p_rc).optimal_buffer_level;
          (pAVar3->p_rc).bits_off_target = iVar5;
          (pAVar3->p_rc).buffer_level = iVar5;
        }
      }
      else {
        av1_svc_check_reset_layer_rc_flag(cpi);
      }
    }
  }
  return aVar12;
}

Assistant:

static aom_codec_err_t ctrl_set_bitrate_one_pass_cbr(aom_codec_alg_priv_t *ctx,
                                                     va_list args) {
  AV1_PRIMARY *const ppi = ctx->ppi;
  AV1_COMP *const cpi = ppi->cpi;
  AV1EncoderConfig *oxcf = &cpi->oxcf;
  if (!is_one_pass_rt_params(cpi) || oxcf->rc_cfg.mode != AOM_CBR ||
      cpi->ppi->use_svc || ppi->num_fp_contexts != 1 || ppi->cpi_lap != NULL) {
    return AOM_CODEC_INVALID_PARAM;
  }
  const int new_bitrate = CAST(AV1E_SET_BITRATE_ONE_PASS_CBR, args);
  ctx->cfg.rc_target_bitrate = new_bitrate;
  oxcf->rc_cfg.target_bandwidth = new_bitrate * 1000;
  set_primary_rc_buffer_sizes(oxcf, ppi);
  av1_new_framerate(cpi, cpi->framerate);
  check_reset_rc_flag(cpi);
  return AOM_CODEC_OK;
}